

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::
SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_10U>
::SmallVector(SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_10U>
              *this,SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_10U>
                    *RHS)

{
  U *pUVar1;
  
  pUVar1 = &(this->
            super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
            ).
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
            .
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
            .FirstEl;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX = pUVar1;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX = pUVar1;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
  .super_SmallVectorBase.CapacityX = this + 1;
  if ((RHS->
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
      ).
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
      .super_SmallVectorBase.BeginX !=
      (RHS->
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
      ).
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
      .super_SmallVectorBase.EndX) {
    SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
    ::operator=(&this->
                 super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
                ,&RHS->
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<164U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<94U,_Fixpp::Type::Char>_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<147U,_Fixpp::Type::String>_>,_Fixpp::TagT<356U,_Fixpp::Type::Int>,_Fixpp::TagT<357U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
               );
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }